

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.h
# Opt level: O2

Particle * __thiscall
BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
          (Particle *__return_storage_ptr__,
          BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *this,PositionType minPosition,
          PositionType maxPosition)

{
  FP FVar1;
  FP FVar2;
  MomentumType momentum;
  PositionType local_40;
  MomentumType local_38;
  
  local_40.x = BaseFixture::urand(&this->super_BaseFixture,minPosition.x,maxPosition.x);
  FVar1 = BaseFixture::urand(&this->super_BaseFixture,-10.0,10.0);
  FVar2 = BaseFixture::urand(&this->super_BaseFixture,-10.0,10.0);
  local_38.z = BaseFixture::urand(&this->super_BaseFixture,-10.0,10.0);
  local_38.x = FVar1;
  local_38.y = FVar2;
  FVar1 = BaseFixture::urand(&this->super_BaseFixture,1e-05,100000.0);
  pica::Particle<(pica::Dimension)1>::Particle(__return_storage_ptr__,&local_40,&local_38,FVar1,0);
  return __return_storage_ptr__;
}

Assistant:

Particle randomParticle(PositionType minPosition, PositionType maxPosition)
    {
        PositionType position;
        for (int d = 0; d < dimension; d++)
            position[d] = urand(minPosition[d], maxPosition[d]);
        Real minMomentum = -10;
        Real maxMomentum = 10;
        MomentumType momentum(urand(minMomentum, maxMomentum),
            urand(minMomentum, maxMomentum), urand(minMomentum, maxMomentum));
        FactorType factor = static_cast<FactorType>(urand(1e-5, 1e5));
        return Particle(position, momentum, factor, 0);
    }